

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzerSettings.cpp
# Opt level: O1

bool __thiscall ModbusAnalyzerSettings::SetSettingsFromInterfaces(ModbusAnalyzerSettings *this)

{
  U32 UVar1;
  double dVar2;
  Channel aCStack_28 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mInputChannel,aCStack_28);
  Channel::~Channel(aCStack_28);
  UVar1 = AnalyzerSettingInterfaceInteger::GetInteger();
  this->mBitRate = UVar1;
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mParity = (ParityAndStopbits)(long)dVar2;
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mInverted = (int)(long)dVar2 != 0;
  dVar2 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mModbusMode = (Mode)(long)dVar2;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return true;
}

Assistant:

bool ModbusAnalyzerSettings::SetSettingsFromInterfaces()
{
    /*
     * 	if( AnalyzerEnums::Parity( U32( mParityInterface->GetNumber() ) ) != AnalyzerEnums::None )
            if( ModbusAnalyzerEnums::Mode( U32( mModbusModeInterface->GetNumber() ) ) != ModbusAnalyzerEnums::Normal )
            {
                SetErrorText( "Sorry, but we don't support using parity at the same time as MP mode." );
                return false;
            }
    */
    mInputChannel = mInputChannelInterface->GetChannel();
    mBitRate = mBitRateInterface->GetInteger();
    // mBitsPerTransfer = U32( mBitsPerTransferInterface->GetNumber() );
    // mStopBits = mStopBitsInterface->GetNumber();
    mParity = ModbusAnalyzerEnums::ParityAndStopbits( U32( mParityInterface->GetNumber() ) );
    // mShiftOrder =  AnalyzerEnums::ShiftOrder( U32( mShiftOrderInterface->GetNumber() ) );
    mInverted = bool( U32( mInvertedInterface->GetNumber() ) );
    // mUseAutobaud = mUseAutobaudInterface->GetValue();
    mModbusMode = ModbusAnalyzerEnums::Mode( U32( mModbusModeInterface->GetNumber() ) );

    ClearChannels();
    AddChannel( mInputChannel, "Modbus", true );

    return true;
}